

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O2

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  string *psVar1;
  cmMakefile *this;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  CacheEntryType CVar5;
  cmValue cVar6;
  cmState *this_00;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar7;
  cmAlphaNum *this_01;
  ulong uVar8;
  string_view separator;
  string_view value;
  string initialValue;
  cmAlphaNum local_d0;
  string local_a0;
  string local_80;
  cmAlphaNum local_60;
  
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0;
  if (uVar8 == 0x40) {
    bVar2 = false;
    PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot(status->Makefile);
    cVar6 = cmStateSnapshot::GetDefinition
                      ((cmStateSnapshot *)&local_d0,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (PVar4 - NEW < 3) {
      if (cVar6.Value != (string *)0x0) goto LAB_002c0813;
      bVar2 = false;
    }
    else if (PVar4 == WARN) {
      bVar2 = operator!=(cVar6,(nullptr_t)0x0);
    }
    this_00 = cmMakefile::GetState(status->Makefile);
    cVar6 = cmState::GetCacheEntryValue
                      (this_00,(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (cVar6.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&initialValue,"Off",(allocator<char> *)&local_d0);
      pcVar7 = extraout_RDX_00;
LAB_002c0895:
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x60) {
        std::__cxx11::string::_M_assign((string *)&initialValue);
        pcVar7 = extraout_RDX_01;
      }
      value._M_str = pcVar7;
      value._M_len = (size_t)initialValue._M_dataplus._M_p;
      bVar3 = cmValue::IsOn((cmValue *)initialValue._M_string_length,value);
      psVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar7 = "OFF";
      if (bVar3) {
        pcVar7 = "ON";
      }
      cmMakefile::AddCacheDefinition
                (status->Makefile,psVar1,pcVar7,psVar1[1]._M_dataplus._M_p,BOOL,false);
      PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
      if (PVar4 != NEW) {
        PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0126,false);
        if (PVar4 == NEW) {
          cmMakefile::GetStateSnapshot(status->Makefile);
          cmStateSnapshot::RemoveDefinition
                    ((cmStateSnapshot *)&local_d0,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (bVar2 != false) {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cVar6 = cmStateSnapshot::GetDefinition
                          ((cmStateSnapshot *)&local_d0,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        if (cVar6.Value == (string *)0x0) {
          this = status->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_80,(cmPolicies *)0x4d,id);
          local_d0.View_._M_len = local_80._M_string_length;
          local_d0.View_._M_str = local_80._M_dataplus._M_p;
          local_60.View_._M_len = 0x59;
          local_60.View_._M_str =
               "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
          ;
          cmStrCat<std::__cxx11::string,char[3]>
                    (&local_a0,&local_d0,&local_60,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,(char (*) [3])0x5c488f);
          cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      goto LAB_002c0809;
    }
    CVar5 = cmState::GetCacheEntryType
                      (this_00,(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (CVar5 == UNINITIALIZED) {
      std::__cxx11::string::string((string *)&initialValue,(string *)cVar6.Value);
      pcVar7 = extraout_RDX;
      goto LAB_002c0895;
    }
    psVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"HELPSTRING",(allocator<char> *)&local_60);
    cmState::SetCacheEntryProperty
              (this_00,psVar1,(string *)&local_d0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    this_01 = &local_d0;
  }
  else {
    local_d0.View_._M_len = 0x2b;
    local_d0.View_._M_str = "called with incorrect number of arguments: ";
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_a0,args,separator,(string_view)ZEXT816(0));
    local_60.View_._M_len = local_a0._M_string_length;
    local_60.View_._M_str = local_a0._M_dataplus._M_p;
    cmStrCat<>(&initialValue,&local_d0,&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002c0809:
    this_01 = (cmAlphaNum *)&initialValue;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_002c0813:
  return uVar8 == 0x40;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1].c_str(), cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}